

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Id __thiscall
dxil_spv::Converter::Impl::get_id_for_constant(Impl *this,Constant *constant,uint forced_width)

{
  ConstantFP *pCVar1;
  bool bVar2;
  TypeID TVar3;
  uint uVar4;
  uint uVar5;
  Type *pTVar6;
  Constant *pCVar7;
  APFloat *pAVar8;
  APInt *pAVar9;
  uint64_t uVar10;
  float fVar11;
  double d;
  uint local_12c;
  Id local_100;
  Id local_fc;
  UndefValue *local_f8;
  UndefValue *undef_2;
  Constant *c_2;
  ConstantDataVector *pCStack_e0;
  uint i_2;
  ConstantDataVector *vec;
  UndefValue *local_d0;
  UndefValue *undef_1;
  Constant *c_1;
  ConstantDataArray *pCStack_b8;
  uint i_1;
  ConstantDataArray *array;
  UndefValue *local_a8;
  UndefValue *undef;
  Constant *c;
  ConstantAggregate *pCStack_90;
  uint i;
  ConstantAggregate *agg;
  undefined1 local_80 [4];
  Id type_id;
  Vector<spv::Id> constituents;
  int physical_width;
  uint integer_width;
  ConstantFP *fp_2;
  ConstantFP *fp_1;
  uint16_t local_3a;
  Constant *pCStack_38;
  uint16_t f16;
  ConstantFP *fp;
  Builder *builder;
  Constant *pCStack_20;
  uint forced_width_local;
  Constant *constant_local;
  Impl *this_local;
  
  builder._4_4_ = forced_width;
  pCStack_20 = constant;
  constant_local = (Constant *)this;
  fp = (ConstantFP *)SPIRVModule::get_builder(this->spirv_module);
  pTVar6 = LLVMBC::Value::getType(&pCStack_20->super_Value);
  TVar3 = LLVMBC::Type::getTypeID(pTVar6);
  switch(TVar3) {
  case HalfTyID:
    pCStack_38 = &LLVMBC::cast<LLVMBC::ConstantFP>(&pCStack_20->super_Value)->super_Constant;
    pAVar8 = LLVMBC::Constant::getValueAPF(pCStack_38);
    _fp_1 = LLVMBC::APFloat::bitcastToAPInt(pAVar8);
    uVar10 = LLVMBC::APInt::getZExtValue((APInt *)&fp_1);
    local_3a = (uint16_t)uVar10;
    bVar2 = support_native_fp16_operations(this);
    pCVar1 = fp;
    if (bVar2) {
      this_local._4_4_ = spv::Builder::makeFloat16Constant((Builder *)fp,local_3a,false);
    }
    else {
      fVar11 = half_to_float(local_3a);
      this_local._4_4_ = spv::Builder::makeFloatConstant((Builder *)pCVar1,fVar11,false);
    }
    break;
  case FloatTyID:
    pCVar7 = &LLVMBC::cast<LLVMBC::ConstantFP>(&pCStack_20->super_Value)->super_Constant;
    pCVar1 = fp;
    pAVar8 = LLVMBC::Constant::getValueAPF(pCVar7);
    fVar11 = LLVMBC::APFloat::convertToFloat(pAVar8);
    this_local._4_4_ = spv::Builder::makeFloatConstant((Builder *)pCVar1,fVar11,false);
    break;
  case DoubleTyID:
    pCVar7 = &LLVMBC::cast<LLVMBC::ConstantFP>(&pCStack_20->super_Value)->super_Constant;
    pCVar1 = fp;
    pAVar8 = LLVMBC::Constant::getValueAPF(pCVar7);
    d = LLVMBC::APFloat::convertToDouble(pAVar8);
    this_local._4_4_ = spv::Builder::makeDoubleConstant((Builder *)pCVar1,d,false);
    break;
  case IntegerTyID:
    if (builder._4_4_ == 0) {
      pTVar6 = LLVMBC::Value::getType(&pCStack_20->super_Value);
      local_12c = LLVMBC::Type::getIntegerBitWidth(pTVar6);
    }
    else {
      local_12c = builder._4_4_;
    }
    constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_12c;
    constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = physical_integer_bit_width(local_12c);
    pCVar1 = fp;
    if ((uint)constituents.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage == 1) {
      pAVar9 = LLVMBC::Constant::getUniqueInteger(pCStack_20);
      uVar10 = LLVMBC::APInt::getZExtValue(pAVar9);
      this_local._4_4_ = spv::Builder::makeBoolConstant((Builder *)pCVar1,uVar10 != 0,false);
    }
    else if ((uint)constituents.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage == 0x10) {
      pAVar9 = LLVMBC::Constant::getUniqueInteger(pCStack_20);
      uVar10 = LLVMBC::APInt::getZExtValue(pAVar9);
      this_local._4_4_ =
           spv::Builder::makeUint16Constant((Builder *)pCVar1,(unsigned_short)uVar10,false);
    }
    else if ((uint)constituents.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage == 0x20) {
      pAVar9 = LLVMBC::Constant::getUniqueInteger(pCStack_20);
      uVar10 = LLVMBC::APInt::getZExtValue(pAVar9);
      this_local._4_4_ = spv::Builder::makeUintConstant((Builder *)pCVar1,(uint)uVar10,false);
    }
    else if ((uint)constituents.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage == 0x40) {
      pAVar9 = LLVMBC::Constant::getUniqueInteger(pCStack_20);
      uVar10 = LLVMBC::APInt::getZExtValue(pAVar9);
      this_local._4_4_ = spv::Builder::makeUint64Constant((Builder *)pCVar1,uVar10,false);
    }
    else {
      this_local._4_4_ = 0;
    }
    break;
  default:
    this_local._4_4_ = 0;
    break;
  case ArrayTyID:
  case StructTyID:
  case VectorTyID:
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_80);
    pTVar6 = LLVMBC::Value::getType(&pCStack_20->super_Value);
    agg._4_4_ = get_type_id(this,pTVar6,0);
    bVar2 = LLVMBC::isa<LLVMBC::ConstantAggregateZero>(&pCStack_20->super_Value);
    if (bVar2) {
      this_local._4_4_ = spv::Builder::makeNullConstant((Builder *)fp,agg._4_4_);
    }
    else {
      pCStack_90 = LLVMBC::dyn_cast<LLVMBC::ConstantAggregate>(&pCStack_20->super_Value);
      if (pCStack_90 == (ConstantAggregate *)0x0) {
        pCStack_b8 = LLVMBC::dyn_cast<LLVMBC::ConstantDataArray>(&pCStack_20->super_Value);
        if (pCStack_b8 == (ConstantDataArray *)0x0) {
          pCStack_e0 = LLVMBC::dyn_cast<LLVMBC::ConstantDataVector>(&pCStack_20->super_Value);
          if (pCStack_e0 == (ConstantDataVector *)0x0) {
            this_local._4_4_ = 0;
            goto LAB_00140bf4;
          }
          pTVar6 = LLVMBC::Value::getType((Value *)pCStack_e0);
          uVar4 = LLVMBC::Type::getVectorNumElements(pTVar6);
          std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::reserve
                    ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_80
                     ,(ulong)uVar4);
          for (c_2._4_4_ = 0; uVar4 = c_2._4_4_,
              uVar5 = LLVMBC::ConstantDataVector::getNumElements(pCStack_e0), uVar4 < uVar5;
              c_2._4_4_ = c_2._4_4_ + 1) {
            undef_2 = (UndefValue *)
                      LLVMBC::ConstantDataVector::getElementAsConstant(pCStack_e0,c_2._4_4_);
            local_f8 = LLVMBC::dyn_cast<LLVMBC::UndefValue>((Value *)undef_2);
            if (local_f8 == (UndefValue *)0x0) {
              local_100 = get_id_for_constant(this,&undef_2->super_Constant,0);
              std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                         local_80,&local_100);
            }
            else {
              local_fc = get_id_for_undef_constant(this,local_f8);
              std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                         local_80,&local_fc);
            }
          }
        }
        else {
          pTVar6 = LLVMBC::Value::getType((Value *)pCStack_b8);
          uVar10 = LLVMBC::Type::getArrayNumElements(pTVar6);
          std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::reserve
                    ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_80
                     ,uVar10);
          for (c_1._4_4_ = 0; uVar4 = c_1._4_4_,
              uVar5 = LLVMBC::ConstantDataArray::getNumElements(pCStack_b8), uVar4 < uVar5;
              c_1._4_4_ = c_1._4_4_ + 1) {
            undef_1 = (UndefValue *)
                      LLVMBC::ConstantDataArray::getElementAsConstant(pCStack_b8,c_1._4_4_);
            local_d0 = LLVMBC::dyn_cast<LLVMBC::UndefValue>((Value *)undef_1);
            if (local_d0 == (UndefValue *)0x0) {
              vec._0_4_ = get_id_for_constant(this,&undef_1->super_Constant,0);
              std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                         local_80,(value_type_conflict1 *)&vec);
            }
            else {
              vec._4_4_ = get_id_for_undef_constant(this,local_d0);
              std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                         local_80,(value_type_conflict1 *)((long)&vec + 4));
            }
          }
        }
      }
      else {
        uVar4 = LLVMBC::ConstantAggregate::getNumOperands(pCStack_90);
        std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::reserve
                  ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_80,
                   (ulong)uVar4);
        for (c._4_4_ = 0; uVar4 = c._4_4_,
            uVar5 = LLVMBC::ConstantAggregate::getNumOperands(pCStack_90), uVar4 < uVar5;
            c._4_4_ = c._4_4_ + 1) {
          undef = (UndefValue *)LLVMBC::ConstantAggregate::getOperand(pCStack_90,c._4_4_);
          local_a8 = LLVMBC::dyn_cast<LLVMBC::UndefValue>((Value *)undef);
          if (local_a8 == (UndefValue *)0x0) {
            array._0_4_ = get_id_for_constant(this,&undef->super_Constant,0);
            std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                       local_80,(value_type_conflict1 *)&array);
          }
          else {
            array._4_4_ = get_id_for_undef_constant(this,local_a8);
            std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                       local_80,(value_type_conflict1 *)((long)&array + 4));
          }
        }
      }
      this_local._4_4_ =
           spv::Builder::makeCompositeConstant((Builder *)fp,agg._4_4_,(Vector<Id> *)local_80,false)
      ;
    }
LAB_00140bf4:
    agg._0_4_ = 1;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_80);
  }
  return this_local._4_4_;
}

Assistant:

spv::Id Converter::Impl::get_id_for_constant(const llvm::Constant *constant, unsigned forced_width)
{
	auto &builder = spirv_module.get_builder();

	switch (constant->getType()->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
	{
		auto *fp = llvm::cast<llvm::ConstantFP>(constant);
		auto f16 = uint16_t(fp->getValueAPF().bitcastToAPInt().getZExtValue());

		if (support_native_fp16_operations())
			return builder.makeFloat16Constant(f16);
		else
			return builder.makeFloatConstant(half_to_float(f16));
	}

	case llvm::Type::TypeID::FloatTyID:
	{
		auto *fp = llvm::cast<llvm::ConstantFP>(constant);
		return builder.makeFloatConstant(fp->getValueAPF().convertToFloat());
	}

	case llvm::Type::TypeID::DoubleTyID:
	{
		auto *fp = llvm::cast<llvm::ConstantFP>(constant);
		return builder.makeDoubleConstant(fp->getValueAPF().convertToDouble());
	}

	case llvm::Type::TypeID::IntegerTyID:
	{
		unsigned integer_width = forced_width ? forced_width : constant->getType()->getIntegerBitWidth();
		int physical_width = physical_integer_bit_width(integer_width);
		switch (physical_width)
		{
		case 1:
			return builder.makeBoolConstant(constant->getUniqueInteger().getZExtValue() != 0);

		case 16:
			return builder.makeUint16Constant(constant->getUniqueInteger().getZExtValue());

		case 32:
			return builder.makeUintConstant(constant->getUniqueInteger().getZExtValue());

		case 64:
			return builder.makeUint64Constant(constant->getUniqueInteger().getZExtValue());

		default:
			return 0;
		}
	}

	case llvm::Type::TypeID::VectorTyID:
	case llvm::Type::TypeID::ArrayTyID:
	case llvm::Type::TypeID::StructTyID:
	{
		Vector<spv::Id> constituents;
		spv::Id type_id = get_type_id(constant->getType());

		if (llvm::isa<llvm::ConstantAggregateZero>(constant))
		{
			return builder.makeNullConstant(type_id);
		}
		else if (auto *agg = llvm::dyn_cast<llvm::ConstantAggregate>(constant))
		{
			constituents.reserve(agg->getNumOperands());
			for (unsigned i = 0; i < agg->getNumOperands(); i++)
			{
				llvm::Constant *c = agg->getOperand(i);
				if (const auto *undef = llvm::dyn_cast<llvm::UndefValue>(c))
					constituents.push_back(get_id_for_undef_constant(undef));
				else
					constituents.push_back(get_id_for_constant(c, 0));
			}
		}
		else if (auto *array = llvm::dyn_cast<llvm::ConstantDataArray>(constant))
		{
			constituents.reserve(array->getType()->getArrayNumElements());
			for (unsigned i = 0; i < array->getNumElements(); i++)
			{
				llvm::Constant *c = array->getElementAsConstant(i);
				if (const auto *undef = llvm::dyn_cast<llvm::UndefValue>(c))
					constituents.push_back(get_id_for_undef_constant(undef));
				else
					constituents.push_back(get_id_for_constant(c, 0));
			}
		}
		else if (auto *vec = llvm::dyn_cast<llvm::ConstantDataVector>(constant))
		{
			constituents.reserve(vec->getType()->getVectorNumElements());
			for (unsigned i = 0; i < vec->getNumElements(); i++)
			{
				llvm::Constant *c = vec->getElementAsConstant(i);
				if (const auto *undef = llvm::dyn_cast<llvm::UndefValue>(c))
					constituents.push_back(get_id_for_undef_constant(undef));
				else
					constituents.push_back(get_id_for_constant(c, 0));
			}
		}
		else
			return 0;

		return builder.makeCompositeConstant(type_id, constituents);
	}

	default:
		return 0;
	}
}